

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

int gdImageSetInterpolationMethod(gdImagePtr im,gdInterpolationMethod id)

{
  code *pcVar1;
  
  if (id < (GD_NEAREST_NEIGHBOUR|GD_BSPLINE) && im != (gdImagePtr)0x0) {
    pcVar1 = (interpolation_method)0x0;
    switch(id) {
    case GD_DEFAULT:
      im->interpolation = filter_linear;
      return 0;
    case GD_BELL:
      pcVar1 = filter_bell;
      break;
    case GD_BESSEL:
      pcVar1 = filter_bessel;
      break;
    case GD_BILINEAR_FIXED:
    case GD_LINEAR:
      pcVar1 = filter_linear;
      break;
    case GD_BICUBIC:
    case GD_BICUBIC_FIXED:
      pcVar1 = filter_bicubic;
      break;
    case GD_BLACKMAN:
      pcVar1 = filter_blackman;
      break;
    case GD_BOX:
      pcVar1 = filter_box;
      break;
    case GD_BSPLINE:
      pcVar1 = filter_bspline;
      break;
    case GD_CATMULLROM:
      pcVar1 = filter_catmullrom;
      break;
    case GD_GAUSSIAN:
      pcVar1 = filter_gaussian;
      break;
    case GD_GENERALIZED_CUBIC:
      pcVar1 = filter_generalized_cubic;
      break;
    case GD_HERMITE:
      pcVar1 = filter_hermite;
      break;
    case GD_HAMMING:
      pcVar1 = filter_hamming;
      break;
    case GD_HANNING:
      pcVar1 = filter_hanning;
      break;
    case GD_MITCHELL:
      pcVar1 = filter_mitchell;
      break;
    case GD_NEAREST_NEIGHBOUR:
    case GD_WEIGHTED4:
      break;
    case GD_POWER:
      pcVar1 = filter_power;
      break;
    case GD_QUADRATIC:
      pcVar1 = filter_quadratic;
      break;
    case GD_SINC:
      pcVar1 = filter_sinc;
      break;
    case GD_TRIANGLE:
      pcVar1 = filter_triangle;
      break;
    default:
      return 0;
    }
    im->interpolation = pcVar1;
    im->interpolation_id = id;
    return 1;
  }
  return 0;
}

Assistant:

BGD_DECLARE(int) gdImageSetInterpolationMethod(gdImagePtr im, gdInterpolationMethod id)
{
	if (im == NULL || (uintmax_t)id > GD_METHOD_COUNT) {
		return 0;
	}

	switch (id) {
		case GD_NEAREST_NEIGHBOUR:
		case GD_WEIGHTED4:
			im->interpolation = NULL;
			break;

		/* generic versions*/
		/* GD_BILINEAR_FIXED and GD_BICUBIC_FIXED are kept for BC reasons */
		case GD_BILINEAR_FIXED:
		case GD_LINEAR:
			im->interpolation = filter_linear;
			break;
		case GD_BELL:
			im->interpolation = filter_bell;
			break;
		case GD_BESSEL:
			im->interpolation = filter_bessel;
			break;
		case GD_BICUBIC_FIXED:
		case GD_BICUBIC:
			im->interpolation = filter_bicubic;
			break;
		case GD_BLACKMAN:
			im->interpolation = filter_blackman;
			break;
		case GD_BOX:
			im->interpolation = filter_box;
			break;
		case GD_BSPLINE:
			im->interpolation = filter_bspline;
			break;
		case GD_CATMULLROM:
			im->interpolation = filter_catmullrom;
			break;
		case GD_GAUSSIAN:
			im->interpolation = filter_gaussian;
			break;
		case GD_GENERALIZED_CUBIC:
			im->interpolation = filter_generalized_cubic;
			break;
		case GD_HERMITE:
			im->interpolation = filter_hermite;
			break;
		case GD_HAMMING:
			im->interpolation = filter_hamming;
			break;
		case GD_HANNING:
			im->interpolation = filter_hanning;
			break;
		case GD_MITCHELL:
			im->interpolation = filter_mitchell;
			break;
		case GD_POWER:
			im->interpolation = filter_power;
			break;
		case GD_QUADRATIC:
			im->interpolation = filter_quadratic;
			break;
		case GD_SINC:
			im->interpolation = filter_sinc;
			break;
		case GD_TRIANGLE:
			im->interpolation = filter_triangle;
			break;
		case GD_DEFAULT:
			id = GD_LINEAR;
			im->interpolation = filter_linear;
		default:
			return 0;
			break;
	}
	im->interpolation_id = id;
	return 1;
}